

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O0

int EVP_PBE_scrypt(char *password,size_t password_len,uint8_t *salt,size_t salt_len,uint64_t N,
                  uint64_t r,uint64_t p,size_t max_mem,uint8_t *out_key,size_t key_len)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  long lVar4;
  uchar *out;
  EVP_MD *pEVar5;
  int iVar6;
  ulong local_90;
  uint64_t i;
  block_t *V;
  block_t *T;
  int ret;
  block_t *B;
  size_t V_blocks;
  size_t T_blocks;
  size_t B_bytes;
  size_t B_blocks;
  size_t max_scrypt_blocks;
  uint64_t r_local;
  uint64_t N_local;
  size_t salt_len_local;
  uint8_t *salt_local;
  size_t password_len_local;
  char *password_local;
  
  if (((((r == 0) || (p == 0)) ||
       (auVar1._8_8_ = 0, auVar1._0_8_ = r,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3fffffff)) / auVar1,0) < p)) ||
      ((N < 2 || ((N & N - 1) != 0)))) ||
     ((0x100000000 < N || ((r << 4 < 0x40 && ((ulong)(1L << ((byte)(r << 4) & 0x3f)) <= N)))))) {
    ERR_put_error(6,0,0x85,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                  ,0xa1);
    password_local._4_4_ = 0;
  }
  else {
    if (max_mem == 0) {
      max_mem = 0x4100000;
    }
    uVar3 = max_mem / (r << 7);
    if ((uVar3 < p + 1) || ((uVar3 - p) - 1 < N)) {
      ERR_put_error(6,0,0x84,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/scrypt.cc"
                    ,0xad);
      password_local._4_4_ = 0;
    }
    else {
      lVar4 = p * 2 * r;
      iVar6 = (int)lVar4 * 0x40;
      out = (uchar *)OPENSSL_calloc(lVar4 + r * 2 + N * 2 * r,0x40);
      if (out == (uchar *)0x0) {
        password_local._4_4_ = 0;
      }
      else {
        T._4_4_ = 0;
        pEVar5 = EVP_sha256();
        iVar2 = PKCS5_PBKDF2_HMAC(password,(int)password_len,salt,(int)salt_len,1,pEVar5,iVar6,out);
        if (iVar2 != 0) {
          for (local_90 = 0; local_90 < p; local_90 = local_90 + 1) {
            scryptROMix((block_t *)(out + r * 2 * local_90 * 0x40),r,N,
                        (block_t *)(out + lVar4 * 0x40),(block_t *)(out + lVar4 * 0x40) + r * 2);
          }
          pEVar5 = EVP_sha256();
          iVar6 = PKCS5_PBKDF2_HMAC(password,(int)password_len,out,iVar6,1,pEVar5,(int)key_len,
                                    out_key);
          if (iVar6 != 0) {
            T._4_4_ = 1;
          }
        }
        OPENSSL_free(out);
        password_local._4_4_ = T._4_4_;
      }
    }
  }
  return password_local._4_4_;
}

Assistant:

int EVP_PBE_scrypt(const char *password, size_t password_len,
                   const uint8_t *salt, size_t salt_len, uint64_t N, uint64_t r,
                   uint64_t p, size_t max_mem, uint8_t *out_key,
                   size_t key_len) {
  if (r == 0 || p == 0 || p > SCRYPT_PR_MAX / r ||
      // |N| must be a power of two.
      N < 2 || (N & (N - 1)) ||
      // We only support |N| <= 2^32 in |scryptROMix|.
      N > UINT64_C(1) << 32 ||
      // Check that |N| < 2^(128×r / 8).
      (16 * r <= 63 && N >= UINT64_C(1) << (16 * r))) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PARAMETERS);
    return 0;
  }

  // Determine the amount of memory needed. B, T, and V are |p|, 1, and |N|
  // scrypt blocks, respectively. Each scrypt block is 2*|r| |block_t|s.
  if (max_mem == 0) {
    max_mem = SCRYPT_MAX_MEM;
  }

  size_t max_scrypt_blocks = max_mem / (2 * r * sizeof(block_t));
  if (max_scrypt_blocks < p + 1 || max_scrypt_blocks - p - 1 < N) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MEMORY_LIMIT_EXCEEDED);
    return 0;
  }

  // Allocate and divide up the scratch space. |max_mem| fits in a size_t, which
  // is no bigger than uint64_t, so none of these operations may overflow.
  static_assert(UINT64_MAX >= SIZE_MAX, "size_t exceeds uint64_t");
  size_t B_blocks = p * 2 * r;
  size_t B_bytes = B_blocks * sizeof(block_t);
  size_t T_blocks = 2 * r;
  size_t V_blocks = N * 2 * r;
  block_t *B = reinterpret_cast<block_t *>(
      OPENSSL_calloc(B_blocks + T_blocks + V_blocks, sizeof(block_t)));
  if (B == NULL) {
    return 0;
  }

  int ret = 0;
  block_t *T = B + B_blocks;
  block_t *V = T + T_blocks;

  // NOTE: PKCS5_PBKDF2_HMAC can only fail due to allocation failure
  // or |iterations| of 0 (we pass 1 here). This is consistent with
  // the documented failure conditions of EVP_PBE_scrypt.
  if (!PKCS5_PBKDF2_HMAC(password, password_len, salt, salt_len, 1,
                         EVP_sha256(), B_bytes, (uint8_t *)B)) {
    goto err;
  }

  for (uint64_t i = 0; i < p; i++) {
    scryptROMix(B + 2 * r * i, r, N, T, V);
  }

  if (!PKCS5_PBKDF2_HMAC(password, password_len, (const uint8_t *)B, B_bytes, 1,
                         EVP_sha256(), key_len, out_key)) {
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(B);
  return ret;
}